

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O1

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals
          (FastAndEffectiveFeaturePreservingMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *ppvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ParameterSet *pPVar6;
  pointer pVVar7;
  bool bVar8;
  size_type __new_size;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  FaceIter FVar18;
  undefined1 local_c8 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  double threshold_T;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  int local_84;
  undefined1 auStack_80 [4];
  int face_neighbor_index;
  FaceIter f_it;
  undefined1 auStack_58 [8];
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  int local_34 [2];
  int normal_iteration_number;
  
  pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
  ppvVar1 = &all_face_neighbor.
             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  auStack_58 = (undefined1  [8])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"Face Neighbor","");
  bVar8 = ParameterSet::getValue(pPVar6,(string *)auStack_58,&local_84);
  if (auStack_58 != (undefined1  [8])ppvVar1) {
    operator_delete((void *)auStack_58);
  }
  if (bVar8) {
    pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
    auStack_58 = (undefined1  [8])ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"Threshold T","");
    bVar8 = ParameterSet::getValue
                      (pPVar6,(string *)auStack_58,
                       (double *)
                       &face_neighbor.
                        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (auStack_58 != (undefined1  [8])ppvVar1) {
      operator_delete((void *)auStack_58);
    }
    if (bVar8) {
      pPVar6 = (this->super_MeshDenoisingBase).parameter_set_;
      auStack_58 = (undefined1  [8])ppvVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_58,"Normal Iteration Num.","");
      bVar8 = ParameterSet::getValue(pPVar6,(string *)auStack_58,local_34);
      if (auStack_58 != (undefined1  [8])ppvVar1) {
        operator_delete((void *)auStack_58);
      }
      if (bVar8) {
        auStack_58 = (undefined1  [8])0x0;
        all_face_neighbor.
        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        all_face_neighbor.
        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getAllFaceNeighbor
                  (&this->super_MeshDenoisingBase,mesh,
                   (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    *)auStack_58,(uint)(local_84 != 0),true);
        __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                            .
                                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 + 0x28))(mesh);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        resize(filtered_normals,__new_size);
        threshold_T = 0.0;
        previous_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        previous_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getFaceNormal
                  (&this->super_MeshDenoisingBase,mesh,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)&threshold_T);
        if (0 < local_34[0]) {
          iVar12 = 0;
          do {
            _auStack_80 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
            while( true ) {
              FVar18 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
              if (f_it.mesh_._0_4_ == (BaseHandle)FVar18.hnd_.super_BaseHandle.idx_ &&
                  _auStack_80 == FVar18.mesh_) break;
              lVar11 = (long)(int)f_it.mesh_._0_4_ * 0x18;
              f_it._8_8_ = *(undefined8 *)((long)threshold_T + lVar11);
              dVar13 = *(double *)((long)threshold_T + 8 + lVar11);
              dVar2 = *(double *)((long)threshold_T + 0x10 + lVar11);
              std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         local_c8,(vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   *)((long)auStack_58 + lVar11));
              uVar9 = (uint)((ulong)((long)face_neighbor.
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                    (long)local_c8) >> 2);
              if ((int)uVar9 < 1) {
                dVar16 = 0.0;
                dVar17 = 0.0;
                dVar15 = 0.0;
              }
              else {
                dVar15 = 0.0;
                uVar10 = 0;
                dVar17 = 0.0;
                dVar16 = 0.0;
                do {
                  lVar11 = (long)(((pointer)((long)local_c8 + uVar10 * 4))->super_BaseHandle).idx_;
                  dVar3 = *(double *)((long)threshold_T + lVar11 * 0x18);
                  dVar4 = *(double *)((long)threshold_T + 8 + lVar11 * 0x18);
                  dVar5 = *(double *)((long)threshold_T + 0x10 + lVar11 * 0x18);
                  dVar14 = (dVar2 * dVar5 + dVar13 * dVar4 + (double)f_it._8_8_ * dVar3 + 0.0) -
                           (double)face_neighbor.
                                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  dVar14 = (double)((ulong)(dVar14 * dVar14) & -(ulong)(0.0 < dVar14));
                  dVar16 = dVar16 + dVar3 * dVar14;
                  dVar17 = dVar17 + dVar4 * dVar14;
                  dVar15 = dVar15 + dVar14 * dVar5;
                  uVar10 = uVar10 + 1;
                } while ((uVar9 & 0x7fffffff) != uVar10);
              }
              dVar13 = dVar15 * dVar15 + dVar16 * dVar16 + dVar17 * dVar17;
              if (dVar13 < 0.0) {
                f_it._8_8_ = dVar15;
                dVar13 = sqrt(dVar13);
                dVar15 = (double)f_it._8_8_;
              }
              else {
                dVar13 = SQRT(dVar13);
              }
              lVar11 = (long)(int)f_it.mesh_._0_4_;
              pVVar7 = (filtered_normals->
                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar7[lVar11].super_VectorDataT<double,_3>.values_[0] = dVar16 / dVar13;
              pVVar7[lVar11].super_VectorDataT<double,_3>.values_[1] = dVar17 / dVar13;
              pVVar7[lVar11].super_VectorDataT<double,_3>.values_[2] = dVar15 / dVar13;
              if (local_c8 != (undefined1  [8])0x0) {
                operator_delete((void *)local_c8);
              }
              f_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it.mesh_._0_4_ + 1);
              if (f_it.mesh_._4_4_ != 0) {
                OpenMesh::Iterators::
                GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)auStack_80);
              }
            }
            std::
            vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
            operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)&threshold_T,filtered_normals);
            iVar12 = iVar12 + 1;
          } while (iVar12 < local_34[0]);
        }
        if (threshold_T != 0.0) {
          operator_delete((void *)threshold_T);
        }
        std::
        vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                   *)auStack_58);
      }
    }
  }
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    // get parameter for normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double threshold_T;
    if(!parameter_set_->getValue(string("Threshold T"), threshold_T))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, true);

    filtered_normals.resize(mesh.n_faces());

    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            TriMesh::Normal ni = previous_normals[f_it->idx()];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[f_it->idx()];
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            for(int i = 0; i <(int)face_neighbor.size(); i++)
            {
                TriMesh::Normal nj = previous_normals[face_neighbor[i].idx()];
                double value = (ni | nj) - threshold_T;
                double weight = (value > 0) ? value * value : 0;
                temp_normal += nj * weight;
            }
            temp_normal.normalize();
            filtered_normals[f_it->idx()] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}